

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::write_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  mz_ulong mVar4;
  uint8_t *puVar5;
  ulong uVar6;
  Entry local_100;
  undefined1 local_e4 [8];
  PayloadHeaderRaw raw;
  PayloadHeader header_1;
  uint32_t crc;
  mz_ulong zsize;
  PayloadHeaderRaw header_raw;
  PayloadHeader header;
  uint8_t *new_zlib_buffer;
  mz_ulong compressed_bound;
  char str [41];
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
  local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
  local_48;
  iterator itr;
  PayloadWriteFlags flags_local;
  size_t size_local;
  void *blob_local;
  Hash hash_local;
  StreamArchive *pSStack_18;
  ResourceTag tag_local;
  StreamArchive *this_local;
  
  if (((this->alive & 1U) == 0) || (this->mode == ReadOnly)) {
    this_local._7_1_ = false;
  }
  else {
    itr.
    super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
    ._M_cur._4_4_ = flags;
    blob_local = (void *)hash;
    hash_local._4_4_ = tag;
    pSStack_18 = this;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
         ::find(this->seen_blobs + tag,(key_type *)&blob_local);
    local_50._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>>
                   (this->seen_blobs + hash_local._4_4_);
    bVar1 = std::__detail::operator!=(&local_48,&local_50);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      sprintf((char *)&compressed_bound,"%0*x",0x18,(ulong)hash_local._4_4_);
      sprintf(str + 0x10,"%016lx",blob_local);
      sVar3 = fwrite(&compressed_bound,1,0x28,(FILE *)this->file);
      if (sVar3 == 0x28) {
        if ((itr.
             super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
             ._M_cur._4_4_ & 1) == 0) {
          if ((itr.
               super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
               ._M_cur._4_4_ & 2) == 0) {
            header_1.crc = 0;
            if ((itr.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                 ._M_cur._4_4_ & 8) != 0) {
              mVar4 = mz_crc32(0,(mz_uint8 *)blob,size);
              header_1.crc = (uint32_t)mVar4;
            }
            raw.data[0xc] = '\x01';
            raw.data[0xd] = '\0';
            raw.data[0xe] = '\0';
            raw.data[0xf] = '\0';
            header_1.payload_size = header_1.crc;
            raw.data._8_4_ = (uint32_t)size;
            header_1.format = (uint32_t)size;
            memset(local_e4,0,0x10);
            convert_to_le((PayloadHeaderRaw *)local_e4,(PayloadHeader *)(raw.data + 8));
            sVar3 = fwrite(local_e4,1,0x10,(FILE *)this->file);
            if (sVar3 != 0x10) {
              return false;
            }
            sVar3 = fwrite(blob,1,size,(FILE *)this->file);
            if (sVar3 != size) {
              return false;
            }
          }
          else {
            mVar4 = mz_compressBound(size);
            if (this->zlib_buffer_size < mVar4) {
              puVar5 = (uint8_t *)realloc(this->zlib_buffer,mVar4);
              if (puVar5 == (uint8_t *)0x0) {
                free(this->zlib_buffer);
                this->zlib_buffer = (uint8_t *)0x0;
                this->zlib_buffer_size = 0;
              }
              else {
                this->zlib_buffer = puVar5;
                this->zlib_buffer_size = mVar4;
              }
            }
            if (this->zlib_buffer == (uint8_t *)0x0) {
              return false;
            }
            memset(header_raw.data + 8,0,0x10);
            memset(&zsize,0,0x10);
            header_raw.data[0xc] = '\x02';
            header_raw.data[0xd] = '\0';
            header_raw.data[0xe] = '\0';
            header_raw.data[0xf] = '\0';
            unique0x00012000 = this->zlib_buffer_size;
            iVar2 = 1;
            if ((itr.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                 ._M_cur._4_4_ & 4) != 0) {
              iVar2 = 9;
            }
            iVar2 = mz_compress2(this->zlib_buffer,(mz_ulong *)&header_1.uncompressed_size,
                                 (uchar *)blob,size,iVar2);
            if (iVar2 != 0) {
              return false;
            }
            header_raw.data._8_4_ = SUB84(stack0xffffffffffffff40,0);
            if ((itr.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                 ._M_cur._4_4_ & 8) != 0) {
              mz_crc32(0,this->zlib_buffer,stack0xffffffffffffff40);
            }
            convert_to_le((PayloadHeaderRaw *)&zsize,(PayloadHeader *)(header_raw.data + 8));
            sVar3 = fwrite(&zsize,1,0x10,(FILE *)this->file);
            if (sVar3 != 0x10) {
              return false;
            }
            sVar3 = fwrite(this->zlib_buffer,1,(ulong)(uint)header_raw.data._8_4_,(FILE *)this->file
                          );
            if (sVar3 != (uint)header_raw.data._8_4_) {
              return false;
            }
          }
        }
        else {
          if (size < 0x10) {
            return false;
          }
          sVar3 = fwrite(blob,1,size,(FILE *)this->file);
          if (sVar3 != size) {
            return false;
          }
        }
        uVar6 = (ulong)hash_local._4_4_;
        memset(&local_100,0,0x18);
        std::
        unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>
        ::emplace<unsigned_long&,Fossilize::StreamArchive::Entry>
                  ((unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>
                    *)(this->seen_blobs + uVar6),(unsigned_long *)&blob_local,&local_100);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		if (fwrite(str, 1, FOSSILIZE_BLOB_HASH_LENGTH, file) != FOSSILIZE_BLOB_HASH_LENGTH)
			return false;

		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
		{
			// The raw payload already contains the header, so just dump it straight to disk.
			if (size < sizeof(PayloadHeaderRaw))
				return false;
			if (fwrite(blob, 1, size, file) != size)
				return false;
		}
		else if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			auto compressed_bound = mz_compressBound(size);

			if (zlib_buffer_size < compressed_bound)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, compressed_bound));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = compressed_bound;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}
			}

			if (!zlib_buffer)
				return false;

			PayloadHeader header = {};
			PayloadHeaderRaw header_raw = {};
			header.uncompressed_size = uint32_t(size);
			header.format = FOSSILIZE_COMPRESSION_DEFLATE;

			mz_ulong zsize = zlib_buffer_size;
			if (mz_compress2(zlib_buffer, &zsize, static_cast<const unsigned char *>(blob), size,
			                 (flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0 ? MZ_BEST_COMPRESSION : MZ_BEST_SPEED) != MZ_OK)
				return false;

			header.payload_size = uint32_t(zsize);
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				header.crc = uint32_t(mz_crc32(MZ_CRC32_INIT, zlib_buffer, zsize));

			convert_to_le(header_raw, header);
			if (fwrite(&header_raw, 1, sizeof(header_raw), file) != sizeof(header_raw))
				return false;

			if (fwrite(zlib_buffer, 1, header.payload_size, file) != header.payload_size)
				return false;
		}
		else
		{
			uint32_t crc = 0;
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<const unsigned char *>(blob), size));

			PayloadHeader header = { uint32_t(size), FOSSILIZE_COMPRESSION_NONE, crc, uint32_t(size) };
			PayloadHeaderRaw raw = {};
			convert_to_le(raw, header);

			if (fwrite(&raw, 1, sizeof(raw), file) != sizeof(raw))
				return false;

			if (fwrite(blob, 1, size, file) != size)
				return false;
		}

		// The entry is irrelevant, we're not going to read from this archive any time soon.
		seen_blobs[tag].emplace(hash, Entry{});
		return true;
	}